

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::internal::GeneratedMessageReflection::FindKnownExtensionByName
          (GeneratedMessageReflection *this,string *name)

{
  long lVar1;
  FieldDescriptor *pFVar2;
  Descriptor *pDVar3;
  ulong uVar4;
  long lVar5;
  
  if (this->extensions_offset_ == -1) {
    return (FieldDescriptor *)0x0;
  }
  pFVar2 = DescriptorPool::FindExtensionByName(this->descriptor_pool_,name);
  if (pFVar2 == (FieldDescriptor *)0x0) {
    pDVar3 = this->descriptor_;
  }
  else {
    pDVar3 = this->descriptor_;
    if (*(Descriptor **)(pFVar2 + 0x38) == pDVar3) {
      return pFVar2;
    }
  }
  if (*(char *)(*(long *)(pDVar3 + 0x20) + 0x58) == '\x01') {
    pDVar3 = DescriptorPool::FindMessageTypeByName(this->descriptor_pool_,name);
    if (pDVar3 != (Descriptor *)0x0) {
      uVar4 = (ulong)*(uint *)(pDVar3 + 0x68);
      if ((int)*(uint *)(pDVar3 + 0x68) < 1) {
        uVar4 = 0;
      }
      for (lVar5 = 0; uVar4 * 0x78 - lVar5 != 0; lVar5 = lVar5 + 0x78) {
        lVar1 = *(long *)(pDVar3 + 0x70);
        if ((((*(Descriptor **)(lVar1 + 0x38 + lVar5) == this->descriptor_) &&
             (*(int *)(lVar1 + 0x2c + lVar5) == 0xb)) && (*(int *)(lVar1 + 0x30 + lVar5) == 1)) &&
           (*(Descriptor **)(lVar1 + 0x48 + lVar5) == pDVar3)) {
          return (FieldDescriptor *)(lVar1 + lVar5);
        }
      }
    }
  }
  return (FieldDescriptor *)0x0;
}

Assistant:

const FieldDescriptor* GeneratedMessageReflection::FindKnownExtensionByName(
    const string& name) const {
  if (extensions_offset_ == -1) return NULL;

  const FieldDescriptor* result = descriptor_pool_->FindExtensionByName(name);
  if (result != NULL && result->containing_type() == descriptor_) {
    return result;
  }

  if (descriptor_->options().message_set_wire_format()) {
    // MessageSet extensions may be identified by type name.
    const Descriptor* type = descriptor_pool_->FindMessageTypeByName(name);
    if (type != NULL) {
      // Look for a matching extension in the foreign type's scope.
      for (int i = 0; i < type->extension_count(); i++) {
        const FieldDescriptor* extension = type->extension(i);
        if (extension->containing_type() == descriptor_ &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() &&
            extension->message_type() == type) {
          // Found it.
          return extension;
        }
      }
    }
  }

  return NULL;
}